

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

bool __thiscall
duckdb::BitpackingState<unsigned_char,signed_char>::
Flush<duckdb::BitpackingCompressionState<unsigned_char,true,signed_char>::BitpackingWriter>
          (BitpackingState<unsigned_char,signed_char> *this)

{
  BitpackingState<unsigned_char,signed_char> *result;
  BitpackingState<unsigned_char,signed_char> BVar1;
  long lVar2;
  int iVar3;
  BitpackingState<unsigned_char,signed_char> BVar4;
  byte bVar5;
  unsigned_long uVar6;
  ulong uVar7;
  byte bVar8;
  bool bVar9;
  byte bVar10;
  
  bVar9 = true;
  if (*(idx_t *)(this + 0x1810) != 0) {
    if (((this[0x1830] == (BitpackingState<unsigned_char,signed_char>)0x0) &&
        (this[0x1829] != this[0x1828])) || (1 < (byte)((char)this[0x1833] - 1U))) {
      result = this + 0x182a;
      BVar4 = (BitpackingState<unsigned_char,signed_char>)
              TrySubtractOperator::Operation<unsigned_char,unsigned_char,unsigned_char>
                        ((uint8_t)this[0x1829],(uint8_t)this[0x1828],(uint8_t *)result);
      this[0x1832] = BVar4;
      BitpackingState<unsigned_char,_signed_char>::CalculateDeltaStats
                ((BitpackingState<unsigned_char,_signed_char> *)this);
      if (this[0x1831] == (BitpackingState<unsigned_char,signed_char>)0x1) {
        BVar4 = this[0x182b];
        if ((this[0x182c] == BVar4) && (((byte)this[0x1833] & 0xfe) != 4)) {
          BitpackingCompressionState<unsigned_char,_true,_signed_char>::BitpackingWriter::
          WriteConstantDelta((char)this[0x182c],**(uchar **)(this + 0x808),*(idx_t *)(this + 0x1810)
                             ,*(uchar **)(this + 0x808),(bool *)(this + 0x1010),
                             *(void **)(this + 0x1820));
          *(long *)(this + 0x1818) = *(long *)(this + 0x1818) + 6;
          return true;
        }
        BVar1 = this[0x182d];
        if (BVar1 == (BitpackingState<unsigned_char,signed_char>)0x0) {
          bVar5 = 0;
        }
        else {
          iVar3 = 0x1f;
          if (BVar1 != (BitpackingState<unsigned_char,signed_char>)0x0) {
            for (; (byte)BVar1 >> iVar3 == 0; iVar3 = iVar3 + -1) {
            }
          }
          bVar8 = 8 - ((byte)iVar3 ^ 7);
          bVar5 = 8;
          if (bVar8 < 8) {
            bVar5 = bVar8;
          }
        }
        BVar1 = *result;
        if (BVar1 == (BitpackingState<unsigned_char,signed_char>)0x0) {
          bVar8 = 0;
        }
        else {
          iVar3 = 0x1f;
          if (BVar1 != (BitpackingState<unsigned_char,signed_char>)0x0) {
            for (; (byte)BVar1 >> iVar3 == 0; iVar3 = iVar3 + -1) {
            }
          }
          bVar10 = 8 - ((byte)iVar3 ^ 7);
          bVar8 = 8;
          if (bVar10 < 8) {
            bVar8 = bVar10;
          }
        }
        BVar1 = this[0x1833];
        if (BVar1 != (BitpackingState<unsigned_char,signed_char>)0x5 && bVar5 < bVar8) {
          if (*(long *)(this + 0x1810) != 0) {
            uVar7 = 0;
            do {
              this[uVar7 + 0x810] =
                   (BitpackingState<unsigned_char,signed_char>)
                   ((char)this[uVar7 + 0x810] - (char)BVar4);
              uVar7 = uVar7 + 1;
            } while (uVar7 < *(ulong *)(this + 0x1810));
          }
          BitpackingCompressionState<unsigned_char,_true,_signed_char>::BitpackingWriter::
          WriteDeltaFor((uchar *)(this + 0x810),(bool *)(this + 0x1010),bVar5,(uchar)this[0x182b],
                        (char)this[0x182e],*(uchar **)(this + 0x808),*(idx_t *)(this + 0x1810),
                        *(void **)(this + 0x1820));
          *(long *)(this + 0x1818) = *(long *)(this + 0x1818) + 10;
          uVar7 = *(ulong *)(this + 0x1810);
          if ((uVar7 & 0x1f) != 0) {
            uVar6 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar7 & 0x1f);
            uVar7 = (uVar7 - uVar6) + 0x20;
          }
          *(ulong *)(this + 0x1818) = *(long *)(this + 0x1818) + (bVar5 * uVar7 >> 3);
          if (BVar1 != (BitpackingState<unsigned_char,signed_char>)0x5 && bVar5 < bVar8) {
            return true;
          }
        }
      }
      if (this[0x1832] == (BitpackingState<unsigned_char,signed_char>)0x1) {
        BVar4 = *result;
        if (BVar4 == (BitpackingState<unsigned_char,signed_char>)0x0) {
          bVar5 = 0;
        }
        else {
          iVar3 = 0x1f;
          if (BVar4 != (BitpackingState<unsigned_char,signed_char>)0x0) {
            for (; (byte)BVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
            }
          }
          bVar8 = 8 - ((byte)iVar3 ^ 7);
          bVar5 = 8;
          if (bVar8 < 8) {
            bVar5 = bVar8;
          }
        }
        if (*(long *)(this + 0x1810) != 0) {
          lVar2 = *(long *)(this + 0x808);
          BVar4 = this[0x1828];
          uVar7 = 0;
          do {
            *(char *)(lVar2 + uVar7) = *(char *)(lVar2 + uVar7) - (char)BVar4;
            uVar7 = uVar7 + 1;
          } while (uVar7 < *(ulong *)(this + 0x1810));
        }
        BitpackingCompressionState<unsigned_char,_true,_signed_char>::BitpackingWriter::WriteFor
                  (*(uchar **)(this + 0x808),(bool *)(this + 0x1010),bVar5,(uchar)this[0x1828],
                   *(idx_t *)(this + 0x1810),*(void **)(this + 0x1820));
        uVar7 = *(ulong *)(this + 0x1810);
        if ((uVar7 & 0x1f) != 0) {
          uVar6 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar7 & 0x1f);
          uVar7 = (uVar7 - uVar6) + 0x20;
        }
        *(ulong *)(this + 0x1818) = *(long *)(this + 0x1818) + (bVar5 * uVar7 >> 3) + 9;
      }
      else {
        bVar9 = false;
      }
    }
    else {
      BitpackingCompressionState<unsigned_char,_true,_signed_char>::BitpackingWriter::WriteConstant
                ((uchar)this[0x1829],*(idx_t *)(this + 0x1810),*(void **)(this + 0x1820),
                 (bool)this[0x1830]);
      *(long *)(this + 0x1818) = *(long *)(this + 0x1818) + 5;
    }
  }
  return bVar9;
}

Assistant:

bool Flush() {
		if (compression_buffer_idx == 0) {
			return true;
		}

		if ((all_invalid || maximum == minimum) && (mode == BitpackingMode::AUTO || mode == BitpackingMode::CONSTANT)) {
			OP::WriteConstant(maximum, compression_buffer_idx, data_ptr, all_invalid);
			total_size += sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
			return true;
		}

		CalculateFORStats();
		CalculateDeltaStats();

		if (can_do_delta) {
			if (maximum_delta == minimum_delta && mode != BitpackingMode::FOR && mode != BitpackingMode::DELTA_FOR) {
				// FOR needs to be T (considering hugeint is bigger than idx_t)
				T frame_of_reference = compression_buffer[0];

				OP::WriteConstantDelta(maximum_delta, static_cast<T>(frame_of_reference), compression_buffer_idx,
				                       compression_buffer, compression_buffer_validity, data_ptr);
				total_size += sizeof(T) + sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
				return true;
			}

			// Check if delta has benefit
			auto delta_required_bitwidth =
			    BitpackingPrimitives::MinimumBitWidth<T, false>(static_cast<T>(min_max_delta_diff));
			auto regular_required_bitwidth = BitpackingPrimitives::MinimumBitWidth(min_max_diff);

			if (delta_required_bitwidth < regular_required_bitwidth && mode != BitpackingMode::FOR) {
				SubtractFrameOfReference(delta_buffer, minimum_delta);

				OP::WriteDeltaFor(reinterpret_cast<T *>(delta_buffer), compression_buffer_validity,
				                  delta_required_bitwidth, static_cast<T>(minimum_delta), delta_offset,
				                  compression_buffer, compression_buffer_idx, data_ptr);

				// FOR (frame of reference).
				total_size += sizeof(T);
				// Aligned bitpacking width.
				total_size += AlignValue(sizeof(bitpacking_width_t));
				// Delta offset.
				total_size += sizeof(T);
				// Compressed data size.
				total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, delta_required_bitwidth);

				return true;
			}
		}

		if (can_do_for) {
			auto width = BitpackingPrimitives::MinimumBitWidth<T, false>(min_max_diff);
			SubtractFrameOfReference(compression_buffer, minimum);
			OP::WriteFor(compression_buffer, compression_buffer_validity, width, minimum, compression_buffer_idx,
			             data_ptr);

			total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, width);
			total_size += sizeof(T); // FOR value
			total_size += AlignValue(sizeof(bitpacking_width_t));

			return true;
		}

		return false;
	}